

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O1

void __thiscall KDReports::ReportPrivate::ensureLayouted(ReportPrivate *this)

{
  QDebug QVar1;
  int iVar2;
  qreal qVar3;
  QSizeF QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebug local_88;
  QArrayDataPointer<char16_t> local_80;
  QDebug local_68;
  double local_60;
  char *local_58;
  undefined1 local_50 [24];
  undefined8 local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  if (this->m_pageContentSizeDirty == true) {
    if (0.0 < this->m_layoutWidth) {
      local_60 = this->m_layoutWidth;
      qVar3 = mmToPixels(this->m_marginLeft + this->m_marginRight);
      local_60 = local_60 - qVar3;
      QVar4 = layoutAsOnePage(this,local_60);
      this->m_paperSize = QVar4;
      local_38 = 0x7600000002;
      local_30 = 
      "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
      ;
      local_28 = "void KDReports::ReportPrivate::ensureLayouted()";
      local_20 = "default";
      QMessageLogger::debug();
      QVar1.stream = local_88.stream;
      local_58 = "setPaperSizeFromPrinter: endless printer. m_layoutWidth=";
      ::QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)(local_50 + 8),&local_58);
      QVar5.m_data = (storage_type *)local_50._8_8_;
      QVar5.m_size = (qsizetype)&local_80;
      QString::fromUtf8(QVar5);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_88.stream,this->m_layoutWidth);
      if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.stream,' ');
      }
      QVar1.stream = local_88.stream;
      local_58 = "textDocWidth=";
      ::QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)(local_50 + 8),&local_58);
      QVar6.m_data = (storage_type *)local_50._8_8_;
      QVar6.m_size = (qsizetype)&local_80;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_88.stream,local_60);
      if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.stream,' ');
      }
      QVar1.stream = local_88.stream;
      local_58 = "single page has size";
      ::QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)(local_50 + 8),&local_58);
      QVar7.m_data = (storage_type *)local_50._8_8_;
      QVar7.m_size = (qsizetype)&local_80;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.stream,' ');
      }
      local_50._0_8_ = local_88.stream;
      *(int *)(local_88.stream + 0x28) = *(int *)(local_88.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_68,(QSizeF *)local_50);
      QVar1.stream = local_68.stream;
      local_58 = "pixels";
      ::QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)(local_50 + 8),&local_58);
      QVar8.m_data = (storage_type *)local_50._8_8_;
      QVar8.m_size = (qsizetype)&local_80;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_68.stream,' ');
      }
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug((QDebug *)local_50);
      QDebug::~QDebug(&local_88);
      iVar2 = (*this->m_layout->_vptr_AbstractReportLayout[6])();
      if (iVar2 == 1) goto LAB_00129c6b;
      ensureLayouted();
    }
    QVar4 = paperSize(this);
    setPaperSizeFromPrinter(this,QVar4);
  }
LAB_00129c6b:
  (*this->m_layout->_vptr_AbstractReportLayout[0xd])();
  return;
}

Assistant:

void KDReports::ReportPrivate::ensureLayouted()
{
    // We need to do a layout if
    // m_pageContentSizeDirty is true, i.e. page size has changed etc.
    if (m_pageContentSizeDirty) {
        if (!wantEndlessPrinting()) {
            setPaperSizeFromPrinter(paperSize());
        } else {
            // Get the document to fit into one page
            Q_ASSERT(m_layoutWidth != 0);
            qreal textDocWidth = m_layoutWidth - mmToPixels(m_marginLeft + m_marginRight);
            m_paperSize = layoutAsOnePage(textDocWidth);

            qDebug() << "setPaperSizeFromPrinter: endless printer. m_layoutWidth=" << m_layoutWidth << "textDocWidth=" << textDocWidth << "single page has size" << m_paperSize << "pixels";

            /* cppcheck-suppress assertWithSideEffect */
            Q_ASSERT(m_layout->numberOfPages() == 1);
        }
        // at this point m_pageContentSizeDirty has been set to false in all cases
    }

    m_layout->ensureLayouted();
}